

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

void nk_menubar_end(nk_context *ctx)

{
  float fVar1;
  nk_window *pnVar2;
  nk_panel *pnVar3;
  float fVar4;
  float fVar5;
  
  if ((((ctx != (nk_context *)0x0) && (pnVar2 = ctx->current, pnVar2 != (nk_window *)0x0)) &&
      (pnVar3 = pnVar2->layout, pnVar3 != (nk_panel *)0x0)) && ((pnVar3->flags & 0xa000) == 0)) {
    fVar1 = (pnVar3->row).height;
    fVar5 = (ctx->style).window.spacing.y + fVar1 + (pnVar3->at_y - (pnVar3->menu).y);
    (pnVar3->menu).h = fVar5;
    fVar4 = (pnVar3->bounds).y + fVar5;
    (pnVar3->bounds).y = fVar4;
    fVar5 = (pnVar3->bounds).h - fVar5;
    (pnVar3->bounds).h = fVar5;
    *pnVar3->offset_x = (pnVar3->menu).offset.x;
    *pnVar3->offset_y = (pnVar3->menu).offset.y;
    pnVar3->at_y = fVar4 - fVar1;
    (pnVar3->clip).y = fVar4;
    (pnVar3->clip).h = fVar5;
    nk_push_scissor(&pnVar2->buffer,pnVar3->clip);
    return;
  }
  return;
}

Assistant:

NK_API void
nk_menubar_end(struct nk_context *ctx)
{
struct nk_window *win;
struct nk_panel *layout;
struct nk_command_buffer *out;

NK_ASSERT(ctx);
NK_ASSERT(ctx->current);
NK_ASSERT(ctx->current->layout);
if (!ctx || !ctx->current || !ctx->current->layout)
return;

win = ctx->current;
out = &win->buffer;
layout = win->layout;
if (layout->flags & NK_WINDOW_HIDDEN || layout->flags & NK_WINDOW_MINIMIZED)
return;

layout->menu.h  = layout->at_y - layout->menu.y;
layout->menu.h += layout->row.height + ctx->style.window.spacing.y;

layout->bounds.y += layout->menu.h;
layout->bounds.h -= layout->menu.h;

*layout->offset_x = layout->menu.offset.x;
*layout->offset_y = layout->menu.offset.y;
layout->at_y      = layout->bounds.y - layout->row.height;

layout->clip.y = layout->bounds.y;
layout->clip.h = layout->bounds.h;
nk_push_scissor(out, layout->clip);
}